

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

float GetDraggedColumnOffset(ImGuiColumnsSet *columns,int column_index)

{
  float fVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float local_2c;
  float x;
  ImGuiWindow *window;
  ImGuiContext *g;
  int column_index_local;
  ImGuiColumnsSet *columns_local;
  
  pIVar4 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  if (column_index < 1) {
    __assert_fail("column_index > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x31e5,"float GetDraggedColumnOffset(ImGuiColumnsSet *, int)");
  }
  if (GImGui->ActiveId == columns->ID + column_index) {
    fVar7 = (GImGui->IO).MousePos.x;
    fVar1 = (GImGui->ActiveIdClickOffset).x;
    fVar5 = GetColumnsRectHalfWidth();
    fVar2 = (pIVar3->Pos).x;
    fVar6 = ImGui::GetColumnOffset(column_index + -1);
    local_2c = ImMax<float>(((fVar7 - fVar1) + fVar5) - fVar2,
                            fVar6 + (pIVar4->Style).ColumnsMinSpacing);
    if ((columns->Flags & 4U) != 0) {
      fVar7 = ImGui::GetColumnOffset(column_index + 1);
      local_2c = ImMin<float>(local_2c,fVar7 - (pIVar4->Style).ColumnsMinSpacing);
    }
    return local_2c;
  }
  __assert_fail("g.ActiveId == columns->ID + ImGuiID(column_index)",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                ,0x31e6,"float GetDraggedColumnOffset(ImGuiColumnsSet *, int)");
}

Assistant:

static float GetDraggedColumnOffset(ImGuiColumnsSet* columns, int column_index)
{
    // Active (dragged) column always follow mouse. The reason we need this is that dragging a column to the right edge of an auto-resizing
    // window creates a feedback loop because we store normalized positions. So while dragging we enforce absolute positioning.
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(column_index > 0); // We are not supposed to drag column 0.
    IM_ASSERT(g.ActiveId == columns->ID + ImGuiID(column_index));

    float x = g.IO.MousePos.x - g.ActiveIdClickOffset.x + GetColumnsRectHalfWidth() - window->Pos.x;
    x = ImMax(x, ImGui::GetColumnOffset(column_index - 1) + g.Style.ColumnsMinSpacing);
    if ((columns->Flags & ImGuiColumnsFlags_NoPreserveWidths))
        x = ImMin(x, ImGui::GetColumnOffset(column_index + 1) - g.Style.ColumnsMinSpacing);

    return x;
}